

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O2

Column * __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>
::get_column(Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>
             *this,Index columnIndex)

{
  Column *pCVar1;
  
  _orderRowsIfNecessary(this);
  pCVar1 = _get_column(this,columnIndex);
  return pCVar1;
}

Assistant:

inline typename Base_matrix<Master_matrix>::Column& Base_matrix<Master_matrix>::get_column(Index columnIndex)
{
  _orderRowsIfNecessary();
  return _get_column(columnIndex);
}